

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadSmt.c
# Opt level: O2

Wlc_Ntk_t *
Wlc_ReadSmtBuffer(char *pFileName,char *pBuffer,char *pLimit,int fOldParser,int fPrintTree)

{
  void *__ptr;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  Smt_Prs_t *p;
  Abc_Nam_t *p_00;
  Wlc_Ntk_t *pWVar4;
  uint uVar5;
  char cVar6;
  ulong uVar7;
  Vec_Int_t *__ptr_00;
  int iVar8;
  long lVar9;
  uint uVar10;
  long lVar11;
  bool bVar12;
  
  uVar10 = 0;
  uVar5 = 0;
  bVar1 = false;
  bVar12 = false;
  pcVar3 = pBuffer;
  do {
    if (pLimit <= pcVar3) {
      if (uVar10 == uVar5) {
        if (uVar10 == 0) {
          puts("The input SMTLIB file has no opening or closing parentheses.");
          pWVar4 = (Wlc_Ntk_t *)0x0;
        }
        else {
          p = (Smt_Prs_t *)calloc(1,0x448);
          p->pName = pFileName;
          p->pBuffer = pBuffer;
          p->pLimit = pLimit;
          p->pCur = pBuffer;
          p_00 = Abc_NamStart(1000,0x18);
          p->pStrs = p_00;
          for (iVar8 = 1; lVar11 = 0x10, iVar8 != 0xb; iVar8 = iVar8 + 1) {
            do {
              lVar9 = lVar11;
              if (lVar9 + 0x10 == 0xc0) {
                pcVar3 = (char *)0x0;
                goto LAB_00311ca3;
              }
              lVar11 = lVar9 + 0x10;
            } while (*(int *)((long)&s_Types[0].Type + lVar9) != iVar8);
            pcVar3 = *(char **)((long)&s_Types[0].pName + lVar9);
LAB_00311ca3:
            Abc_NamStrFindOrAdd(p_00,pcVar3,(int *)0x0);
          }
          iVar8 = Abc_NamObjNumMax(p_00);
          if (iVar8 != 0xb) {
            __assert_fail("Abc_NamObjNumMax(p) == SMT_PRS_END",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcReadSmt.c"
                          ,0x67,"void Smt_AddTypes(Abc_Nam_t *)");
          }
          Vec_IntGrow(&p->vStack,100);
          Vec_WecGrow(&p->vObjs,uVar10 + 1);
          Smt_PrsReadLines(p);
          if (fPrintTree != 0) {
            Smt_PrsPrintParser(p);
          }
          if (p->ErrorStr[0] == '\0') {
            if (fOldParser == 0) {
              pWVar4 = Smt_PrsBuild2(p);
            }
            else {
              pWVar4 = Smt_PrsBuild(p);
            }
          }
          else {
            uVar7 = 0;
            for (pcVar3 = p->pBuffer; pcVar3 < p->pCur; pcVar3 = pcVar3 + 1) {
              uVar7 = (ulong)((int)uVar7 + (uint)(*pcVar3 == '\n'));
            }
            pWVar4 = (Wlc_Ntk_t *)0x0;
            printf("Line %d: %s\n",uVar7,p->ErrorStr);
          }
          if (p->pStrs != (Abc_Nam_t *)0x0) {
            Abc_NamDeref(p->pStrs);
          }
          Vec_IntErase(&p->vStack);
          Vec_IntErase(&p->vTempFans);
          __ptr_00 = (p->vObjs).pArray;
          lVar11 = 8;
          for (lVar9 = 0; lVar9 < (p->vObjs).nCap; lVar9 = lVar9 + 1) {
            __ptr = *(void **)((long)&__ptr_00->nCap + lVar11);
            if (__ptr != (void *)0x0) {
              free(__ptr);
              __ptr_00 = (p->vObjs).pArray;
              *(undefined8 *)((long)&__ptr_00->nCap + lVar11) = 0;
            }
            lVar11 = lVar11 + 0x10;
          }
          free(__ptr_00);
          free(p);
        }
      }
      else {
        pWVar4 = (Wlc_Ntk_t *)0x0;
        printf("The input SMTLIB file has different number of opening and closing parentheses (%d and %d).\n"
               ,(ulong)uVar10);
      }
      return pWVar4;
    }
    cVar6 = *pcVar3;
    if (cVar6 == '|') {
      bVar1 = (bool)(bVar1 ^ 1);
    }
    else if (cVar6 == ')') {
      uVar5 = uVar5 + !bVar1;
    }
    else if (cVar6 == '(') {
      uVar10 = uVar10 + !bVar1;
    }
    else {
      if ((cVar6 != ';') || (bVar1)) {
        if ((cVar6 != '\"') || ((pcVar3[-1] == '\\' || (pcVar2 = pcVar3, bVar1))))
        goto LAB_00311c17;
        while( true ) {
          pcVar3 = pcVar2 + 1;
          *pcVar2 = ' ';
          cVar6 = *pcVar3;
          if (cVar6 == '\0') break;
          if ((cVar6 == '\"') && (!bVar12)) {
            bVar12 = false;
            break;
          }
          bVar12 = cVar6 == '\\';
          pcVar2 = pcVar3;
        }
        *pcVar3 = ' ';
      }
      else {
        cVar6 = ';';
        while ((cVar6 != '\0' && (cVar6 != '\n'))) {
          *pcVar3 = ' ';
          pcVar2 = pcVar3 + 1;
          pcVar3 = pcVar3 + 1;
          cVar6 = *pcVar2;
        }
      }
      bVar1 = false;
    }
LAB_00311c17:
    pcVar3 = pcVar3 + 1;
  } while( true );
}

Assistant:

Wlc_Ntk_t * Wlc_ReadSmtBuffer( char * pFileName, char * pBuffer, char * pLimit, int fOldParser, int fPrintTree )
{
    Wlc_Ntk_t * pNtk = NULL;
    int nCount = Smt_PrsRemoveComments( pBuffer, pLimit );
    Smt_Prs_t * p = Smt_PrsAlloc( pFileName, pBuffer, pLimit, nCount );
    if ( p == NULL )
        return NULL;
    Smt_PrsReadLines( p );
    if ( fPrintTree )
        Smt_PrsPrintParser( p );
    if ( Smt_PrsErrorPrint(p) )
        pNtk = fOldParser ? Smt_PrsBuild(p) : Smt_PrsBuild2(p);
    Smt_PrsFree( p );
    return pNtk;
}